

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

SNode * goto_PNode(Parser *p,d_loc_t *loc,PNode *pn,SNode *ps)

{
  uint32 *puVar1;
  SNode **ppSVar2;
  byte bVar3;
  uint uVar4;
  PNode *pn_00;
  D_Reduction *reduction;
  SNode **ppSVar5;
  ZNode *z;
  SNode *sn;
  ulong uVar6;
  ZNode *z_00;
  D_State *pDVar7;
  SNode *pSVar8;
  Reduction *pRVar9;
  SNode *extraout_RAX;
  SNode *pSVar10;
  ulong uVar11;
  D_RightEpsilonHint *pDVar12;
  uint uVar13;
  
  uVar4 = (pn->parse_node).symbol;
  bVar3 = ps->state->goto_valid[(int)uVar4 / 8];
  pSVar8 = (SNode *)(ulong)bVar3;
  if ((bVar3 >> (uVar4 & 7) & 1) != 0) {
    sn = add_SNode(p,p->t->state +
                     (p->t->goto_table[(long)(int)uVar4 - (long)ps->state->goto_table_offset] - 1),
                   loc,(pn->parse_node).scope);
    pn_00 = sn->last_pn;
    if (pn_00 != (PNode *)0x0) {
      puVar1 = &pn_00->refcount;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        free_PNode(p,pn_00);
      }
    }
    pn->refcount = pn->refcount + 1;
    sn->last_pn = pn;
    if (sn != ps) {
      if ((*(uint *)&sn->field_0x24 & 0x7fffffff) <= (*(uint *)&ps->field_0x24 & 0x7fffffff)) {
        *(uint *)&sn->field_0x24 =
             *(uint *)&sn->field_0x24 & 0x80000000 | *(uint *)&ps->field_0x24 + 1 & 0x7fffffff;
      }
    }
    uVar4 = (sn->zns).n;
    uVar11 = (ulong)uVar4;
    if (uVar11 < 4) {
      uVar6 = 0;
      do {
        if (uVar11 == uVar6) goto LAB_001461ed;
        z_00 = (sn->zns).v[uVar6];
        uVar6 = uVar6 + 1;
      } while (z_00->pn != pn);
    }
    else {
      uVar13 = 0;
      for (uVar11 = (ulong)pn % uVar11;
          (((uint)uVar11 < uVar4 && (uVar13 < 5)) &&
          (z_00 = (sn->zns).v[uVar11], z_00 != (ZNode *)0x0));
          uVar11 = (ulong)((uint)uVar11 + 1) % (ulong)uVar4) {
        if (z_00->pn == pn) goto LAB_0014624b;
        uVar13 = uVar13 + 1;
      }
LAB_001461ed:
      z_00 = new_ZNode(p,pn);
      set_add_znode(&sn->zns,z_00);
      for (uVar11 = 0; pDVar7 = sn->state, uVar11 < (pDVar7->reductions).n; uVar11 = uVar11 + 1) {
        reduction = (pDVar7->reductions).v[uVar11];
        if (reduction->nelements != 0) {
          add_Reduction(p,z_00,sn,reduction);
        }
      }
      if (pn->shift == (D_Shift *)0x0) {
        for (uVar11 = 0; uVar11 < (pDVar7->right_epsilon_hints).n; uVar11 = uVar11 + 1) {
          pDVar12 = (pDVar7->right_epsilon_hints).v;
          pSVar8 = find_SNode(p,(uint)pDVar12[uVar11].preceeding_state,sn->initial_scope);
          if (pSVar8 != (SNode *)0x0) {
            pDVar12 = pDVar12 + uVar11;
            for (uVar6 = 0; uVar6 < (pSVar8->zns).n; uVar6 = uVar6 + 1) {
              z = (pSVar8->zns).v[uVar6];
              if ((z != (ZNode *)0x0) &&
                 (pRVar9 = add_Reduction(p,z,pSVar8,(D_Reduction *)pDVar12->reduction),
                 pRVar9 != (Reduction *)0x0)) {
                pRVar9->new_snode = sn;
                pRVar9->new_depth = (uint)pDVar12->depth;
              }
            }
          }
          pDVar7 = sn->state;
        }
      }
    }
LAB_0014624b:
    uVar4 = (z_00->sns).n;
    pSVar8 = (SNode *)(ulong)uVar4;
    ppSVar5 = (z_00->sns).v;
    pSVar10 = (SNode *)0x0;
    do {
      if (pSVar8 == pSVar10) {
        ppSVar2 = (z_00->sns).e;
        if (ppSVar5 == (SNode **)0x0) {
          (z_00->sns).v = ppSVar2;
          (z_00->sns).n = uVar4 + 1;
          (z_00->sns).e[(long)pSVar8] = ps;
          goto LAB_00146345;
        }
        if (ppSVar5 == ppSVar2) {
          if (2 < uVar4) goto LAB_0014633d;
        }
        else if ((uVar4 & 7) == 0) {
LAB_0014633d:
          vec_add_internal(&z_00->sns,ps);
          pSVar8 = extraout_RAX;
          goto LAB_00146345;
        }
        (z_00->sns).n = uVar4 + 1;
        ppSVar5[(long)pSVar8] = ps;
LAB_00146345:
        if (sn == ps) {
          return pSVar8;
        }
        ps->refcount = ps->refcount + 1;
        return pSVar8;
      }
      ppSVar2 = ppSVar5 + (long)pSVar10;
      pSVar10 = (SNode *)((long)&(pSVar10->loc).s + 1);
    } while (*ppSVar2 != ps);
  }
  return pSVar8;
}

Assistant:

static SNode *goto_PNode(Parser *p, d_loc_t *loc, PNode *pn, SNode *ps) {
  SNode *new_ps, *pre_ps;
  ZNode *z = NULL;
  D_State *state;
  uint i, j, k, state_index;

  if (!IS_BIT_SET(ps->state->goto_valid, pn->parse_node.symbol)) return NULL;
  state_index = GOTO_STATE(p, pn, ps);
  state = &p->t->state[state_index];
  new_ps = add_SNode(p, state, loc, pn->parse_node.scope);
  if (new_ps->last_pn) unref_pn(p, new_ps->last_pn);
  ref_pn(pn);
  new_ps->last_pn = pn;

  DBG(printf("goto %d (%s) -> %d %p\n", (int)(ps->state - p->t->state), p->t->symbols[pn->parse_node.symbol].name,
             state_index, (void *)new_ps));
  if (ps != new_ps && new_ps->depth < ps->depth + 1) new_ps->depth = ps->depth + 1;
  /* find/create ZNode */
  z = set_find_znode(&new_ps->zns, pn);
  if (!z) { /* not found */
    set_add_znode(&new_ps->zns, (z = new_ZNode(p, pn)));
    for (j = 0; j < new_ps->state->reductions.n; j++)
      if (new_ps->state->reductions.v[j]->nelements) add_Reduction(p, z, new_ps, new_ps->state->reductions.v[j]);
    if (!pn->shift)
      for (j = 0; j < new_ps->state->right_epsilon_hints.n; j++) {
        D_RightEpsilonHint *h = &new_ps->state->right_epsilon_hints.v[j];
        pre_ps = find_SNode(p, h->preceeding_state, new_ps->initial_scope);
        if (!pre_ps) continue;
        for (k = 0; k < pre_ps->zns.n; k++)
          if (pre_ps->zns.v[k]) {
            Reduction *r = add_Reduction(p, pre_ps->zns.v[k], pre_ps, h->reduction);
            if (r) {
              r->new_snode = new_ps;
              r->new_depth = h->depth;
            }
          }
      }
  }
  for (i = 0; i < z->sns.n; i++)
    if (z->sns.v[i] == ps) break;
  if (i >= z->sns.n) { /* not found */
    vec_add(&z->sns, ps);
    if (new_ps != ps) ref_sn(ps);
  }
  return new_ps;
}